

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositor.cpp
# Opt level: O0

void __thiscall
QOpenGLCompositor::changeWindowIndex
          (QOpenGLCompositor *this,QOpenGLCompositorWindow *window,int newIdx)

{
  int iVar1;
  qsizetype qVar2;
  QOpenGLCompositorWindow **ppQVar3;
  int in_EDX;
  QOpenGLCompositorWindow *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  int idx;
  QOpenGLCompositorWindow *in_stack_ffffffffffffffc8;
  QListSpecialMethodsBase<QOpenGLCompositorWindow_*> *in_stack_ffffffffffffffd0;
  QOpenGLCompositor *this_00;
  
  this_00 = *(QOpenGLCompositor **)(in_FS_OFFSET + 0x28);
  qVar2 = QListSpecialMethodsBase<QOpenGLCompositorWindow*>::indexOf<QOpenGLCompositorWindow*>
                    (in_stack_ffffffffffffffd0,(QOpenGLCompositorWindow **)in_stack_ffffffffffffffc8
                     ,0x1cd7b3);
  iVar1 = (int)qVar2;
  if ((iVar1 != -1) && (iVar1 != in_EDX)) {
    QList<QOpenGLCompositorWindow_*>::move
              ((QList<QOpenGLCompositorWindow_*> *)CONCAT44(in_EDX,iVar1),in_RDI,
               (qsizetype)in_stack_ffffffffffffffd0);
    ensureCorrectZOrder(this_00);
    ppQVar3 = QList<QOpenGLCompositorWindow_*>::constLast
                        ((QList<QOpenGLCompositorWindow_*> *)in_stack_ffffffffffffffc8);
    if (in_RSI == *ppQVar3) {
      QList<QOpenGLCompositorWindow_*>::last
                ((QList<QOpenGLCompositorWindow_*> *)in_stack_ffffffffffffffc8);
      topWindowChanged((QOpenGLCompositor *)0x1cd833,in_stack_ffffffffffffffc8);
    }
  }
  if (*(QOpenGLCompositor **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLCompositor::changeWindowIndex(QOpenGLCompositorWindow *window, int newIdx)
{
    int idx = m_windows.indexOf(window);
    if (idx != -1 && idx != newIdx) {
        m_windows.move(idx, newIdx);
        ensureCorrectZOrder();
        if (window == m_windows.constLast())
            emit topWindowChanged(m_windows.last());
    }
}